

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O0

void __thiscall
rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_equals_Test::TestBody
          (rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_equals_Test *this)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  char *message;
  char *in_R9;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_;
  RateAdaptiveCode<unsigned_short> H2;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_d0;
  undefined1 local_b8 [8];
  RateAdaptiveCode<unsigned_short> H1;
  allocator<unsigned_short> local_29;
  undefined1 local_28 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> rows_to_combine;
  rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_equals_Test *this_local;
  
  rows_to_combine.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  __first = std::array<unsigned_short,_2048UL>::begin
                      ((array<unsigned_short,_2048UL> *)AutogenRateAdapt::rows);
  __last = std::array<unsigned_short,_2048UL>::end
                     ((array<unsigned_short,_2048UL> *)AutogenRateAdapt::rows);
  std::allocator<unsigned_short>::allocator(&local_29);
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)local_28,__first,__last,
             &local_29);
  std::allocator<unsigned_short>::~allocator(&local_29);
  LDPC4QKD::
  FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>
  ::get_pos_varn(&local_d0,
                 (FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>
                  *)LDPC4QKD::encoder_2048x6144_4663d91);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&H2.n_ra_rows,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::RateAdaptiveCode
            ((RateAdaptiveCode<unsigned_short> *)local_b8,&local_d0,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&H2.n_ra_rows,0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&H2.n_ra_rows);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_d0);
  anon_unknown.dwarf_50475::get_code_big_wra();
  local_171 = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==
                        ((RateAdaptiveCode<unsigned_short> *)local_b8,
                         (RateAdaptiveCode<unsigned_short> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)local_170,(AssertionResult *)"H1 == H2","false","true",in_R9);
    message = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (&local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x161,message);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::~RateAdaptiveCode
            ((RateAdaptiveCode<unsigned_short> *)&gtest_ar_.message_);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::~RateAdaptiveCode
            ((RateAdaptiveCode<unsigned_short> *)local_b8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_decoder, obtain_from_advanced_encoder_equals) {
    std::vector<std::uint16_t> rows_to_combine(AutogenRateAdapt::rows.begin(), AutogenRateAdapt::rows.end());
    RateAdaptiveCode<std::uint16_t> H1(encoder_2048x6144_4663d91.get_pos_varn(), rows_to_combine);

    // TODO add random rate adaption for comparison
    auto H2 = get_code_big_wra();
    EXPECT_TRUE(H1 == H2);
}